

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tools.cpp
# Opt level: O0

vector<double,_std::allocator<double>_> *
Tools::stringvec_to_doublevec
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *stringvec)

{
  vector<double,_std::allocator<double>_> *this;
  iterator iVar1;
  iterator iVar2;
  iterator iVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RSI;
  allocator_type *in_RDI;
  vector<double,_std::allocator<double>_> *doublevec;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff78;
  allocator_type *__n;
  
  __n = in_RDI;
  this = (vector<double,_std::allocator<double>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::size(in_RSI);
  std::allocator<double>::allocator((allocator<double> *)0x1914cc);
  std::vector<double,_std::allocator<double>_>::vector(this,(size_type)__n,in_RDI);
  std::allocator<double>::~allocator((allocator<double> *)0x1914ec);
  iVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_ffffffffffffff78);
  iVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_ffffffffffffff78);
  iVar3 = std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff78);
  std::
  transform<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,Tools::stringvec_to_doublevec(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)::__0>
            (iVar1._M_current,iVar2._M_current,iVar3._M_current);
  return (vector<double,_std::allocator<double>_> *)in_RDI;
}

Assistant:

std::vector<double> Tools::stringvec_to_doublevec(std::vector<std::string> stringvec) {
    std::vector<double> doublevec(stringvec.size());
    std::transform(stringvec.begin(), stringvec.end(), doublevec.begin(), [](const std::string &val) {
        try {
            return std::stod(val);
        }
        catch (const std::invalid_argument &ia) {
            throw std::invalid_argument("invalid argument: " + val);
        }
    });
    return doublevec;
}